

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest_AnnotatesCordSemantics_Test::
~CppMetadataTest_AnnotatesCordSemantics_Test(CppMetadataTest_AnnotatesCordSemantics_Test *this)

{
  CppMetadataTest_AnnotatesCordSemantics_Test *this_local;
  
  ~CppMetadataTest_AnnotatesCordSemantics_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(CppMetadataTest, AnnotatesCordSemantics) {
  FileDescriptorProto file;
  GeneratedCodeInfo info;
  std::string pb_h;
  atu::AddFile("test.proto", kCordFieldTestFile);
  EXPECT_TRUE(CaptureMetadata("test.proto", &file, &pb_h, &info, nullptr,
                              nullptr, nullptr));
  EXPECT_EQ("Message", file.message_type(0).name());
  std::vector<int> field_path{FileDescriptorProto::kMessageTypeFieldNumber, 0,
                              DescriptorProto::kFieldFieldNumber, 0};
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "set_sfield" || *substring == "clear_sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
  field_path.back() = 1;
  annotations.clear();
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "set_rsfield" || *substring == "clear_rsfield" ||
               *substring == "add_rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
}